

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O1

int32_t uloc_toLanguageTag_63
                  (char *localeID,char *langtag,int32_t langtagCapacity,UBool strict,
                  UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  int32_t iVar8;
  UErrorCode UVar9;
  size_t sVar10;
  char *pcVar11;
  UEnumeration *en;
  char *pcVar12;
  size_t sVar13;
  VariantListEntry *var;
  char *pcVar14;
  CharString *pCVar15;
  AttributeListEntry *pAVar16;
  ExtensionListEntry *pEVar17;
  long lVar18;
  AttributeListEntry *pAVar19;
  char (*__s2) [3];
  int iVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  char (*__s) [4];
  int iVar24;
  long lVar25;
  ExtensionListEntry *pEVar26;
  bool bVar27;
  UErrorCode tmpStatus_3;
  UErrorCode tmpStatus;
  int32_t resultCapacity;
  int32_t resultCapacity_1;
  ExtensionListEntry *firstExt;
  AttributeListEntry *firstAttr;
  UErrorCode tmpStatus_2;
  int32_t len;
  CharString canonical;
  char buf [100];
  UErrorCode local_268;
  UErrorCode local_264;
  undefined8 local_260;
  AttributeListEntry *local_258;
  char *local_250;
  char *local_248;
  undefined8 local_240;
  int32_t local_238;
  uint local_234;
  undefined8 local_230;
  UEnumeration *local_228;
  ExtensionListEntry *local_220;
  char *local_218;
  AttributeListEntry *local_210;
  int local_204;
  AttributeListEntry *local_200;
  long local_1f8;
  CharStringPool local_1f0;
  int32_t local_1bc;
  CharString local_1b8 [2];
  CharString local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_118.buffer);
  local_118.len = 0;
  *local_118.buffer.ptr = '\0';
  local_264 = U_ZERO_ERROR;
  sVar10 = strlen(localeID);
  local_238 = (int32_t)sVar10;
  if (0 < local_238) {
    while (pcVar11 = icu_63::CharString::getAppendBuffer
                               (&local_118,local_238,local_238,&local_238,&local_264),
          local_264 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar6 = uloc_canonicalize_63(localeID,pcVar11,local_238,&local_264);
      if (local_264 != U_BUFFER_OVERFLOW_ERROR) {
        if (U_ZERO_ERROR < local_264) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          goto LAB_002d4717;
        }
        icu_63::CharString::append(&local_118,pcVar11,iVar6,&local_264);
        if (local_264 == U_STRING_NOT_TERMINATED_WARNING) {
          local_264 = U_ZERO_ERROR;
        }
        if (local_264 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002d471e;
        break;
      }
      local_264 = U_ZERO_ERROR;
      local_238 = iVar6;
    }
    *status = local_264;
LAB_002d4717:
    iVar6 = 0;
    goto LAB_002d57fc;
  }
LAB_002d471e:
  local_250 = langtag;
  pcVar11 = locale_getKeywordsStart_63(local_118.buffer.ptr);
  iVar20 = 0;
  iVar21 = 0;
  if (pcVar11 == local_118.buffer.ptr) {
    en = uloc_openKeywords_63(local_118.buffer.ptr,&local_264);
    pcVar11 = local_250;
    if (en == (UEnumeration *)0x0) {
      iVar21 = 0;
      bVar27 = true;
      iVar6 = 0;
    }
    else {
      iVar6 = uenum_count_63(en,&local_264);
      if (iVar6 == 1) {
        local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
        pcVar12 = uenum_next_63(en,(int32_t *)local_1b8,&local_264);
        bVar27 = true;
        iVar21 = 0;
        if (((int)local_1b8[0].buffer.ptr == 1) && (*pcVar12 == 'x')) {
          local_d8 = CONCAT62(local_d8._2_6_,0x2d78);
          iVar6 = uloc_getKeywordValue_63
                            (localeID,pcVar12,(char *)((long)&local_d8 + 2),0x62,&local_264);
          local_1b8[0].buffer.ptr = (char *)CONCAT44(local_1b8[0].buffer.ptr._4_4_,iVar6);
          if (local_264 < U_ILLEGAL_ARGUMENT_ERROR) {
            UVar2 = _isPrivateuseValueSubtags((char *)((long)&local_d8 + 2),iVar6);
            if (UVar2 == '\0') {
              if (strict == '\0') goto LAB_002d4850;
              goto LAB_002d47e5;
            }
            iVar21 = (int)local_1b8[0].buffer.ptr + 2;
            iVar6 = uprv_min_63(iVar21,langtagCapacity);
            memcpy(pcVar11,&local_d8,(long)iVar6);
            u_terminateChars_63(pcVar11,langtagCapacity,iVar21,status);
          }
          else {
LAB_002d47e5:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            iVar21 = 0;
          }
          bVar27 = false;
        }
      }
      else {
LAB_002d4850:
        bVar27 = true;
        iVar21 = 0;
      }
      uenum_close_63(en);
      iVar6 = 0;
      if (!bVar27) {
        iVar6 = iVar21;
      }
    }
    if (!bVar27) goto LAB_002d57fc;
  }
  local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar6 = uloc_getLanguage_63(local_118.buffer.ptr,(char *)&local_d8,0xc,(UErrorCode *)local_1b8);
    if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
LAB_002d48cb:
      if (iVar6 == 0) {
LAB_002d494a:
        iVar20 = 3;
        pcVar11 = local_250;
        if (0 < langtagCapacity) {
          iVar7 = uprv_min_63(3,langtagCapacity);
          pcVar12 = "und";
LAB_002d499d:
          pcVar11 = local_250;
          memcpy(local_250,pcVar12,(long)iVar7);
        }
      }
      else {
        UVar2 = _isLanguageSubtag((char *)&local_d8,iVar6);
        if (UVar2 == '\0') {
          if (strict != '\0') goto LAB_002d493b;
          goto LAB_002d494a;
        }
        pcVar12 = (char *)&local_d8;
        sVar10 = strlen(pcVar12);
        __s = DEPRECATEDLANGS;
        uVar22 = 0xfffffffffffffffe;
        do {
          sVar13 = strlen(*__s);
          iVar20 = iVar6;
          if (sVar10 < sVar13) break;
          iVar7 = strcmp(pcVar12,*__s);
          if (iVar7 == 0) {
            strcpy((char *)&local_d8,__s[1]);
            sVar10 = strlen((char *)&local_d8);
            iVar20 = (int32_t)sVar10;
            break;
          }
          __s = __s + 2;
          uVar22 = uVar22 + 2;
        } while (uVar22 < 0x9a);
        pcVar11 = local_250;
        if (0 < langtagCapacity) {
          iVar7 = uprv_min_63(iVar20,langtagCapacity);
          goto LAB_002d499d;
        }
      }
      u_terminateChars_63(pcVar11,langtagCapacity,iVar20,status);
    }
    else {
      if (strict == '\0') {
        iVar6 = 0;
        goto LAB_002d48cb;
      }
LAB_002d493b:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  uVar23 = iVar20 + iVar21;
  var = (VariantListEntry *)(ulong)uVar23;
  local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
  local_260 = (char *)((ulong)local_260._4_4_ << 0x20);
  iVar20 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar6 = uloc_getScript_63(local_118.buffer.ptr,(char *)&local_d8,6,(UErrorCode *)local_1b8);
    if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
      pcVar11 = local_250 + (int)uVar23;
      iVar21 = langtagCapacity - uVar23;
      if (iVar6 < 1) {
        iVar20 = 0;
      }
      else {
        UVar2 = _isScriptSubtag((char *)&local_d8,iVar6);
        if (UVar2 == '\0') {
          if (strict != '\0') goto LAB_002d4a3f;
          goto LAB_002d4a49;
        }
        if (0 < iVar21) {
          *pcVar11 = '-';
        }
        if (1 < iVar21) {
          iVar8 = uprv_min_63(iVar6,iVar21 + -1);
          memcpy(pcVar11 + 1,&local_d8,(long)iVar8);
        }
        iVar20 = iVar6 + 1;
      }
      u_terminateChars_63(pcVar11,iVar21,iVar20,status);
    }
    else {
      iVar20 = 0;
      if (strict != '\0') {
LAB_002d4a3f:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002d4a49:
        iVar20 = 0;
      }
    }
  }
  iVar20 = iVar20 + uVar23;
  local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar23 = uloc_getCountry_63(local_118.buffer.ptr,(char *)&local_d8,4,(UErrorCode *)local_1b8);
    var = (VariantListEntry *)(ulong)uVar23;
    if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
      pcVar11 = local_250 + iVar20;
      iVar21 = langtagCapacity - iVar20;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      else {
        UVar2 = _isRegionSubtag((char *)&local_d8,uVar23);
        if (UVar2 == '\0') {
          if (strict != '\0') goto LAB_002d4bae;
          local_260 = (char *)((ulong)local_260 & 0xffffffff00000000);
          goto LAB_002d4ae6;
        }
        if (0 < iVar21) {
          *pcVar11 = '-';
        }
        __s2 = DEPRECATEDREGIONS;
        uVar22 = 0xfffffffffffffffe;
        local_260 = pcVar11;
        do {
          iVar7 = strcmp((char *)&local_d8,*__s2);
          if (iVar7 == 0) {
            strcpy((char *)&local_d8,__s2[1]);
            sVar10 = strlen((char *)&local_d8);
            uVar23 = (uint)sVar10;
            break;
          }
          __s2 = __s2 + 2;
          uVar22 = uVar22 + 2;
        } while (uVar22 < 10);
        pcVar11 = local_260;
        if (1 < iVar21) {
          iVar6 = uprv_min_63(uVar23,iVar21 + -1);
          memcpy(pcVar11 + 1,&local_d8,(long)iVar6);
        }
        uVar23 = uVar23 + 1;
        var = (VariantListEntry *)(ulong)uVar23;
      }
      local_260 = (char *)CONCAT44(local_260._4_4_,uVar23);
      u_terminateChars_63(pcVar11,iVar21,uVar23,status);
    }
    else if (strict != '\0') {
LAB_002d4bae:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
LAB_002d4ae6:
  local_260 = (char *)CONCAT44(local_260._4_4_,(int)local_260 + iVar20);
  local_1f0.status = U_ZERO_ERROR;
  local_230 = 0;
  local_204 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar11 = (char *)&local_d8;
    iVar6 = uloc_getVariant_63(local_118.buffer.ptr,pcVar11,0x9d,&local_1f0.status);
    if (local_1f0.status < U_ILLEGAL_ARGUMENT_ERROR &&
        local_1f0.status != U_STRING_NOT_TERMINATED_WARNING) {
      local_258 = (AttributeListEntry *)(local_250 + (int)local_260);
      iVar20 = langtagCapacity - (int)local_260;
      if (iVar6 < 1) {
        local_230 = 0;
        iVar6 = 0;
      }
      else {
        local_1b8[0].buffer.ptr = (char *)0x0;
        local_230 = 0;
        local_240 = (char *)(CONCAT44(local_240._4_4_,iVar6) ^ 5);
        pcVar12 = (char *)0x0;
        do {
          cVar3 = *pcVar11;
          if (cVar3 == '\0') {
LAB_002d4c9f:
            if (pcVar12 == (char *)0x0) {
LAB_002d4d20:
              if (strict != '\0') {
LAB_002d4e1f:
                UVar9 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002d4e2b:
                *status = UVar9;
                break;
              }
            }
            else {
              cVar5 = *pcVar12;
              pcVar14 = pcVar12;
              while (cVar5 != '\0') {
                cVar5 = uprv_asciitolower_63(cVar5);
                *pcVar14 = cVar5;
                cVar5 = pcVar14[1];
                pcVar14 = pcVar14 + 1;
              }
              UVar2 = _isVariantSubtag(pcVar12,-1);
              if (UVar2 == '\0') {
                if (strict != '\0') goto LAB_002d4e1f;
                UVar2 = _isPrivateuseValueSubtag(pcVar12,-1);
                if (UVar2 != '\0') break;
              }
              else {
                iVar21 = strcmp(pcVar12,"posix");
                if (iVar21 == 0 && (int)local_240 == 0) {
                  local_230 = 1;
                }
                else {
                  var = (VariantListEntry *)uprv_malloc_63(0x10);
                  if (var == (VariantListEntry *)0x0) {
                    UVar9 = U_MEMORY_ALLOCATION_ERROR;
                    goto LAB_002d4e2b;
                  }
                  var->variant = pcVar12;
                  UVar2 = _addVariantToList((VariantListEntry **)local_1b8,var);
                  if (UVar2 == '\0') {
                    uprv_free_63(var);
                    goto LAB_002d4d20;
                  }
                }
              }
            }
            pcVar12 = (char *)0x0;
          }
          else {
            if ((cVar3 == '_') || (cVar3 == '-')) {
              *pcVar11 = '\0';
              cVar3 = '\x01';
              goto LAB_002d4c9f;
            }
            if (pcVar12 == (char *)0x0) {
              pcVar12 = pcVar11;
            }
            cVar3 = '\x01';
          }
          pcVar11 = pcVar11 + 1;
        } while (cVar3 != '\0');
        pAVar16 = (AttributeListEntry *)local_1b8[0].buffer.ptr;
        iVar6 = 0;
        if ((AttributeListEntry *)local_1b8[0].buffer.ptr != (AttributeListEntry *)0x0 &&
            *status < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar6 = 0;
          pAVar19 = (AttributeListEntry *)local_1b8[0].buffer.ptr;
          do {
            if (iVar6 < iVar20) {
              *(char *)((long)&local_258->attribute + (long)iVar6) = '-';
            }
            iVar21 = iVar6 + 1;
            pcVar11 = pAVar19->attribute;
            var = (VariantListEntry *)strlen(pcVar11);
            if (iVar20 - iVar21 != 0 && iVar21 <= iVar20) {
              iVar6 = uprv_min_63((int)var,iVar20 - iVar21);
              memcpy((char *)((long)&local_258->attribute + (long)iVar21),pcVar11,(long)iVar6);
            }
            iVar6 = iVar21 + (int)var;
            pAVar19 = pAVar19->next;
          } while (pAVar19 != (AttributeListEntry *)0x0);
        }
        while (pAVar16 != (AttributeListEntry *)0x0) {
          pAVar19 = pAVar16->next;
          uprv_free_63(pAVar16);
          pAVar16 = pAVar19;
        }
        local_204 = 0;
        if (U_ZERO_ERROR < *status) goto LAB_002d4edd;
      }
      u_terminateChars_63((char *)local_258,iVar20,iVar6,status);
      local_204 = iVar6;
    }
    else {
      if (strict != '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      local_230 = 0;
      local_204 = 0;
    }
  }
LAB_002d4edd:
  pcVar11 = local_118.buffer.ptr;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_78 = 0;
  local_228 = uloc_openKeywords_63(local_118.buffer.ptr,status);
  local_204 = local_204 + (int)local_260;
  if (((char)local_230 == '\0') && (U_ZERO_ERROR < *status)) {
    uenum_close_63(local_228);
LAB_002d57be:
    iVar6 = 0;
  }
  else {
    local_240 = local_250 + local_204;
    local_260 = (char *)CONCAT44(local_260._4_4_,langtagCapacity - local_204);
    iVar6 = 0;
    if ((char)local_230 != '\0' || local_228 != (UEnumeration *)0x0) {
      local_220 = (ExtensionListEntry *)0x0;
      local_210 = (AttributeListEntry *)0x0;
      local_1f0.status = U_ZERO_ERROR;
      icu_63::UVector::UVector
                (&local_1f0.pool,anon_unknown.dwarf_2f8c96::CharStringPool::deleter,
                 (UElementsAreEqual *)0x0,&local_1f0.status);
      local_268 = U_ZERO_ERROR;
      local_258 = (AttributeListEntry *)0x0;
      local_248 = (char *)0x0;
      local_218 = pcVar11;
      do {
        icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_1b8[0].buffer);
        local_1b8[0].len = 0;
        *(char *)(char **)local_1b8[0].buffer.ptr = '\0';
        pcVar12 = uenum_next_63(local_228,(int32_t *)0x0,status);
        if (pcVar12 == (char *)0x0) {
          bVar27 = true;
        }
        else {
          local_234 = 100;
          while (pcVar14 = icu_63::CharString::getAppendBuffer
                                     (local_1b8,local_234,local_234,(int32_t *)&local_234,&local_268
                                     ), local_268 < U_ILLEGAL_ARGUMENT_ERROR) {
            uVar23 = uloc_getKeywordValue_63(pcVar11,pcVar12,pcVar14,local_234,&local_268);
            var = (VariantListEntry *)(ulong)uVar23;
            if (local_268 != U_BUFFER_OVERFLOW_ERROR) break;
            local_268 = U_ZERO_ERROR;
            local_234 = uVar23;
          }
          if (local_268 < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar6 = (int32_t)var;
            icu_63::CharString::append(local_1b8,pcVar14,iVar6,&local_268);
            if (local_268 == U_STRING_NOT_TERMINATED_WARNING) {
              local_268 = U_ZERO_ERROR;
            }
            sVar10 = strlen(pcVar12);
            iVar20 = strcmp(pcVar12,"attribute");
            if (iVar20 == 0) {
              pcVar12 = local_248;
              if (0 < iVar6) {
                iVar20 = 0;
                do {
                  do {
                    if (iVar6 - iVar20 == 0 || iVar6 < iVar20) {
                      uVar23 = 0;
                    }
                    else {
                      iVar21 = 0;
                      uVar22 = 0;
                      do {
                        cVar3 = *(char *)((long)(char **)local_1b8[0].buffer.ptr +
                                         uVar22 + (long)iVar20);
                        if (cVar3 == '-') {
                          uVar23 = -iVar21;
                          iVar20 = (iVar20 - iVar21) + 1;
                          goto LAB_002d5249;
                        }
                        *(char *)((long)&local_d8 + uVar22) = cVar3;
                        uVar22 = uVar22 + 1;
                        iVar21 = iVar21 + -1;
                      } while ((uint)(iVar6 - iVar20) != uVar22);
                      iVar20 = iVar20 - iVar21;
                      uVar23 = -iVar21;
                    }
LAB_002d5249:
                    if (uVar23 == 0) {
                      if (iVar6 <= iVar20) {
                        local_258 = (AttributeListEntry *)0x0;
                        pcVar12 = "attribute";
                        pcVar11 = local_218;
                        goto LAB_002d5504;
                      }
                    }
                    else {
                      *(undefined1 *)((long)&local_d8 + (ulong)uVar23) = 0;
                    }
                    pAVar16 = (AttributeListEntry *)uprv_malloc_63(0x10);
                    UVar9 = U_MEMORY_ALLOCATION_ERROR;
                    if ((pAVar16 == (AttributeListEntry *)0x0) ||
                       (pcVar11 = (char *)uprv_malloc_63((ulong)(uVar23 + 1)),
                       pcVar11 == (char *)0x0)) goto LAB_002d52d5;
                    strcpy(pcVar11,(char *)&local_d8);
                    pAVar16->attribute = pcVar11;
                    UVar2 = _addAttributeToList(&local_210,pAVar16);
                  } while (UVar2 != '\0');
                  uprv_free_63(pAVar16);
                  uprv_free_63(pcVar11);
                } while (strict == '\0');
                UVar9 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002d52d5:
                *status = UVar9;
                local_258 = (AttributeListEntry *)0x0;
                pcVar12 = "attribute";
                pcVar11 = local_218;
              }
LAB_002d5504:
              pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
              if (pEVar17 == (ExtensionListEntry *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
              }
              else {
                pEVar17->key = pcVar12;
                pEVar17->value = (char *)local_258;
                UVar2 = _addExtensionToList(&local_220,pEVar17,'\x01');
                iVar20 = 0;
                if ((UVar2 != '\0') || (uprv_free_63(pEVar17), strict == '\0')) goto LAB_002d5309;
                *status = U_ILLEGAL_ARGUMENT_ERROR;
              }
              iVar20 = 3;
            }
            else {
              if ((int32_t)sVar10 < 2) {
                if (*pcVar12 == 'x') {
                  cVar3 = _isPrivateuseValueSubtags(local_1b8[0].buffer.ptr,iVar6);
joined_r0x002d544c:
                  if (cVar3 != '\0') {
                    pCVar15 = anon_unknown.dwarf_2f8c96::CharStringPool::create(&local_1f0);
                    if (pCVar15 == (CharString *)0x0) {
                      *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002d54a5:
                      iVar20 = 3;
                      bVar27 = false;
                    }
                    else {
                      icu_63::CharString::append(pCVar15,local_1b8[0].buffer.ptr,iVar6,&local_268);
                      if (U_ZERO_ERROR < local_268) {
                        *status = local_268;
                        goto LAB_002d54a5;
                      }
                      local_258 = (AttributeListEntry *)(pCVar15->buffer).ptr;
                      iVar20 = 0;
                      bVar27 = true;
                    }
                    if (bVar27) goto LAB_002d5504;
                    goto LAB_002d5309;
                  }
                }
                else {
                  UVar2 = _isExtensionSingleton(pcVar12,(int32_t)sVar10);
                  if (UVar2 != '\0') {
                    local_200 = (AttributeListEntry *)local_1b8[0].buffer.ptr;
                    iVar8 = iVar6;
                    if (iVar6 < 0) {
                      sVar10 = strlen(local_1b8[0].buffer.ptr);
                      iVar8 = (int32_t)sVar10;
                    }
                    pAVar16 = local_200;
                    if (iVar8 < 1) {
                      pcVar14 = (char *)0x0;
                    }
                    else {
                      lVar18 = (long)iVar8;
                      lVar25 = 0;
                      pcVar14 = (char *)0x0;
                      pAVar19 = local_200;
                      local_1f8 = lVar18;
                      do {
                        if (*(char *)((long)&pAVar19->attribute + lVar25) == '-') {
                          if (pcVar14 == (char *)0x0) goto LAB_002d5447;
                          UVar2 = _isExtensionSubtag(pcVar14,(int)pAVar16 - (int)pcVar14);
                          pcVar14 = (char *)0x0;
                          pAVar19 = local_200;
                          lVar18 = local_1f8;
                          if (UVar2 == '\0') goto LAB_002d5449;
                        }
                        else if (pcVar14 == (char *)0x0) {
                          pcVar14 = (char *)((long)&pAVar19->attribute + lVar25);
                        }
                        pAVar16 = (AttributeListEntry *)((long)&pAVar16->attribute + 1);
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < lVar18);
                    }
                    if (pcVar14 == (char *)0x0) {
LAB_002d5447:
                      pcVar14 = (char *)0x0;
                    }
                    else {
                      bVar4 = _isExtensionSubtag(pcVar14,(int)pAVar16 - (int)pcVar14);
                      pcVar14 = (char *)(ulong)bVar4;
                    }
LAB_002d5449:
                    cVar3 = (char)pcVar14;
                    goto joined_r0x002d544c;
                  }
                }
                if (strict == '\0') goto LAB_002d52fe;
                goto LAB_002d51d3;
              }
              pcVar14 = uloc_toUnicodeLocaleKey_63(pcVar12);
              if (pcVar14 == (char *)0x0) {
                if (strict == '\0') {
                  iVar20 = 2;
                }
                else {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  iVar20 = 3;
                }
                pcVar12 = (char *)0x0;
              }
              else {
                local_258 = (AttributeListEntry *)
                            uloc_toUnicodeLocaleType_63(pcVar12,local_1b8[0].buffer.ptr);
                pcVar12 = pcVar14;
                if (local_258 == (AttributeListEntry *)0x0) {
                  if (strict == '\0') {
                    iVar20 = 2;
                  }
                  else {
                    *status = U_ILLEGAL_ARGUMENT_ERROR;
                    iVar20 = 3;
                  }
                  local_258 = (AttributeListEntry *)0x0;
                }
                else {
                  if (local_258 != (AttributeListEntry *)local_1b8[0].buffer.ptr) goto LAB_002d5504;
                  pCVar15 = anon_unknown.dwarf_2f8c96::CharStringPool::create(&local_1f0);
                  if (pCVar15 == (CharString *)0x0) {
                    *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002d54f5:
                    iVar20 = 3;
                  }
                  else {
                    sVar10 = strlen((char *)local_258);
                    iVar6 = (int32_t)sVar10;
                    pcVar14 = icu_63::CharString::getAppendBuffer
                                        (pCVar15,iVar6,iVar6,&local_1bc,&local_268);
                    if (U_ZERO_ERROR < local_268) {
LAB_002d51bd:
                      *status = local_268;
                      goto LAB_002d54f5;
                    }
                    local_248 = pcVar14;
                    strcpy(pcVar14,(char *)local_258);
                    T_CString_toLowerCase_63(local_248);
                    icu_63::CharString::append(pCVar15,local_248,iVar6,&local_268);
                    if (U_ZERO_ERROR < local_268) goto LAB_002d51bd;
                    local_258 = (AttributeListEntry *)(pCVar15->buffer).ptr;
                    iVar20 = 0;
                  }
                  if (iVar20 == 0) goto LAB_002d5504;
                }
              }
            }
          }
          else {
            if (local_268 == U_MEMORY_ALLOCATION_ERROR) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              if (strict == '\0') {
                local_268 = U_ZERO_ERROR;
LAB_002d52fe:
                iVar20 = 2;
                pcVar12 = local_248;
                goto LAB_002d5309;
              }
LAB_002d51d3:
              *status = U_ILLEGAL_ARGUMENT_ERROR;
            }
            iVar20 = 3;
            pcVar12 = local_248;
          }
LAB_002d5309:
          bVar27 = iVar20 == 3;
          local_248 = pcVar12;
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_1b8[0].buffer);
      } while (!bVar27);
      if ((char)local_230 == '\0') {
LAB_002d55d3:
        iVar6 = 0;
        pEVar17 = local_220;
        if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (local_220 != (ExtensionListEntry *)0x0)) {
          bVar27 = false;
          iVar6 = 0;
          local_258 = local_210;
          pEVar26 = local_220;
          do {
            pAVar16 = local_258;
            bVar1 = !bVar27;
            bVar27 = true;
            if (bVar1) {
              sVar10 = strlen(pEVar26->key);
              if (sVar10 < 2) {
                bVar27 = false;
              }
              else {
                if (iVar6 < (int)local_260) {
                  local_240[iVar6] = '-';
                }
                lVar18 = (long)iVar6 + 1;
                if ((int)lVar18 < (int)local_260) {
                  local_240[lVar18] = 'u';
                }
                iVar6 = iVar6 + 2;
              }
            }
            iVar20 = strcmp(pEVar26->key,"attribute");
            if (iVar20 == 0) {
              for (; pAVar16 != (AttributeListEntry *)0x0; pAVar16 = pAVar16->next) {
                if (iVar6 < (int)local_260) {
                  local_240[iVar6] = '-';
                }
                iVar20 = iVar6 + 1;
                pcVar11 = pAVar16->attribute;
                sVar10 = strlen(pcVar11);
                if ((int)local_260 - iVar20 != 0 && iVar20 <= (int)local_260) {
                  iVar6 = uprv_min_63((int)sVar10,(int)local_260 - iVar20);
                  memcpy(local_240 + iVar20,pcVar11,(long)iVar6);
                }
                iVar6 = iVar20 + (int)sVar10;
              }
            }
            else {
              if (iVar6 < (int)local_260) {
                local_240[iVar6] = '-';
              }
              iVar20 = iVar6 + 1;
              pcVar11 = pEVar26->key;
              sVar10 = strlen(pcVar11);
              if ((int)local_260 - iVar20 != 0 && iVar20 <= (int)local_260) {
                iVar6 = uprv_min_63((int)sVar10,(int)local_260 - iVar20);
                memcpy(local_240 + iVar20,pcVar11,(long)iVar6);
              }
              iVar20 = iVar20 + (int)sVar10;
              if (iVar20 < (int)local_260) {
                local_240[iVar20] = '-';
              }
              iVar20 = iVar20 + 1;
              pcVar11 = pEVar26->value;
              sVar10 = strlen(pcVar11);
              if ((int)local_260 - iVar20 != 0 && iVar20 <= (int)local_260) {
                iVar6 = uprv_min_63((int)sVar10,(int)local_260 - iVar20);
                memcpy(local_240 + iVar20,pcVar11,(long)iVar6);
              }
              iVar6 = iVar20 + (int)sVar10;
            }
            pEVar26 = pEVar26->next;
            pEVar17 = local_220;
          } while (pEVar26 != (ExtensionListEntry *)0x0);
        }
      }
      else {
        pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
        if (pEVar17 != (ExtensionListEntry *)0x0) {
          pEVar17->key = "va";
          pEVar17->value = "posix";
          UVar2 = _addExtensionToList(&local_220,pEVar17,'\x01');
          if (UVar2 == '\0') {
            uprv_free_63(pEVar17);
          }
          goto LAB_002d55d3;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
        iVar6 = 0;
        pEVar17 = local_220;
      }
      while (pAVar16 = local_210, pEVar17 != (ExtensionListEntry *)0x0) {
        pEVar26 = pEVar17->next;
        uprv_free_63(pEVar17);
        pEVar17 = pEVar26;
      }
      while (pAVar16 != (AttributeListEntry *)0x0) {
        pAVar19 = pAVar16->next;
        uprv_free_63(pAVar16->attribute);
        uprv_free_63(pAVar16);
        pAVar16 = pAVar19;
      }
      uenum_close_63(local_228);
      UVar9 = *status;
      icu_63::UVector::~UVector(&local_1f0.pool);
      if (U_ZERO_ERROR < UVar9) goto LAB_002d57be;
    }
    iVar6 = u_terminateChars_63(local_240,(int)local_260,iVar6,status);
  }
  iVar20 = iVar6 + local_204;
  local_1f0.status = U_ZERO_ERROR;
  iVar21 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar11 = (char *)&local_d8;
    iVar6 = uloc_getVariant_63(local_118.buffer.ptr,pcVar11,0x9d,&local_1f0.status);
    if (local_1f0.status < U_ILLEGAL_ARGUMENT_ERROR &&
        local_1f0.status != U_STRING_NOT_TERMINATED_WARNING) {
      iVar7 = langtagCapacity - iVar20;
      if (iVar6 < 1) {
        iVar24 = 0;
      }
      else {
        local_260 = (char *)CONCAT44(local_260._4_4_,iVar20);
        pcVar12 = (char *)0x0;
        bVar27 = true;
        iVar24 = 0;
        do {
          cVar3 = *pcVar11;
          if (cVar3 == '\0') {
LAB_002d5899:
            if (pcVar12 != (char *)0x0) {
              cVar5 = *pcVar12;
              pcVar14 = pcVar12;
              while (cVar5 != '\0') {
                cVar5 = uprv_asciitolower_63(cVar5);
                *pcVar14 = cVar5;
                cVar5 = pcVar14[1];
                pcVar14 = pcVar14 + 1;
              }
              UVar2 = _isPrivateuseValueSubtag(pcVar12,-1);
              if (UVar2 == '\0') {
                if (strict != '\0') {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                }
                break;
              }
              if ((!bVar27) || (UVar2 = _isVariantSubtag(pcVar12,-1), UVar2 == '\0')) {
                if (iVar24 < iVar7) {
                  lVar18 = (long)iVar24;
                  iVar24 = iVar24 + 1;
                  local_1b8[0].buffer.stackArray[lVar18 + -0xd] = '-';
                }
                iVar20 = iVar24;
                if (bVar27) {
                  if (iVar24 < iVar7) {
                    lVar18 = (long)iVar24;
                    iVar24 = iVar24 + 1;
                    local_1b8[0].buffer.stackArray[lVar18 + -0xd] = 'x';
                  }
                  if (iVar24 < iVar7) {
                    lVar18 = (long)iVar24;
                    iVar24 = iVar24 + 1;
                    local_1b8[0].buffer.stackArray[lVar18 + -0xd] = '-';
                  }
                  if (iVar7 - iVar24 != 0 && iVar24 <= iVar7) {
                    iVar6 = uprv_min_63(8,iVar7 - iVar24);
                    memcpy(local_1b8[0].buffer.stackArray + (long)iVar24 + -0xd,"lvariant",
                           (long)iVar6);
                  }
                  iVar20 = iVar24 + 8;
                  if (iVar24 + 8 < iVar7) {
                    iVar20 = iVar24 + 9;
                    local_1b8[0].buffer.stackArray[(long)iVar24 + -5] = '-';
                  }
                }
                sVar10 = strlen(pcVar12);
                if (iVar7 - iVar20 != 0 && iVar20 <= iVar7) {
                  iVar6 = uprv_min_63((int)sVar10,iVar7 - iVar20);
                  memcpy(local_1b8[0].buffer.stackArray + (long)iVar20 + -0xd,pcVar12,(long)iVar6);
                }
                iVar24 = iVar20 + (int)sVar10;
                pcVar12 = (char *)0x0;
                bVar27 = false;
                goto LAB_002d59ce;
              }
            }
            pcVar12 = (char *)0x0;
          }
          else {
            if ((cVar3 == '_') || (cVar3 == '-')) {
              *pcVar11 = '\0';
              cVar3 = '\x01';
              goto LAB_002d5899;
            }
            if (pcVar12 == (char *)0x0) {
              pcVar12 = pcVar11;
            }
            cVar3 = '\x01';
          }
LAB_002d59ce:
          pcVar11 = pcVar11 + 1;
        } while (cVar3 != '\0');
        iVar21 = 0;
        iVar20 = (int)local_260;
        if (U_ZERO_ERROR < *status) goto LAB_002d57fa;
      }
      iVar21 = iVar24;
      local_250 = local_250 + iVar20;
      if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (iVar7 - iVar21 != 0 && iVar21 <= iVar7)) {
        iVar6 = uprv_min_63(iVar21,iVar7 - iVar21);
        memcpy(local_250,local_1b8,(long)iVar6);
      }
      u_terminateChars_63(local_250,iVar7,iVar21,status);
    }
    else if (strict != '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      iVar21 = 0;
    }
  }
LAB_002d57fa:
  iVar6 = iVar21 + iVar20;
LAB_002d57fc:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_118.buffer);
  return iVar6;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_toLanguageTag(const char* localeID,
                   char* langtag,
                   int32_t langtagCapacity,
                   UBool strict,
                   UErrorCode* status) {
    icu::CharString canonical;
    int32_t reslen;
    UErrorCode tmpStatus = U_ZERO_ERROR;
    UBool hadPosix = FALSE;
    const char* pKeywordStart;

    /* Note: uloc_canonicalize returns "en_US_POSIX" for input locale ID "".  See #6835 */
    int32_t resultCapacity = static_cast<int32_t>(uprv_strlen(localeID));
    if (resultCapacity > 0) {
        char* buffer;

        for (;;) {
            buffer = canonical.getAppendBuffer(
                    /*minCapacity=*/resultCapacity,
                    /*desiredCapacityHint=*/resultCapacity,
                    resultCapacity,
                    tmpStatus);

            if (U_FAILURE(tmpStatus)) {
                *status = tmpStatus;
                return 0;
            }

            reslen =
                uloc_canonicalize(localeID, buffer, resultCapacity, &tmpStatus);

            if (tmpStatus != U_BUFFER_OVERFLOW_ERROR) {
                break;
            }

            resultCapacity = reslen;
            tmpStatus = U_ZERO_ERROR;
        }

        if (U_FAILURE(tmpStatus)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }

        canonical.append(buffer, reslen, tmpStatus);
        if (tmpStatus == U_STRING_NOT_TERMINATED_WARNING) {
            tmpStatus = U_ZERO_ERROR;  // Terminators provided by CharString.
        }

        if (U_FAILURE(tmpStatus)) {
            *status = tmpStatus;
            return 0;
        }
    }

    reslen = 0;

    /* For handling special case - private use only tag */
    pKeywordStart = locale_getKeywordsStart(canonical.data());
    if (pKeywordStart == canonical.data()) {
        UEnumeration *kwdEnum;
        int kwdCnt = 0;
        UBool done = FALSE;

        kwdEnum = uloc_openKeywords(canonical.data(), &tmpStatus);
        if (kwdEnum != NULL) {
            kwdCnt = uenum_count(kwdEnum, &tmpStatus);
            if (kwdCnt == 1) {
                const char *key;
                int32_t len = 0;

                key = uenum_next(kwdEnum, &len, &tmpStatus);
                if (len == 1 && *key == PRIVATEUSE) {
                    char buf[ULOC_KEYWORD_AND_VALUES_CAPACITY];
                    buf[0] = PRIVATEUSE;
                    buf[1] = SEP;
                    len = uloc_getKeywordValue(localeID, key, &buf[2], sizeof(buf) - 2, &tmpStatus);
                    if (U_SUCCESS(tmpStatus)) {
                        if (_isPrivateuseValueSubtags(&buf[2], len)) {
                            /* return private use only tag */
                            reslen = len + 2;
                            uprv_memcpy(langtag, buf, uprv_min(reslen, langtagCapacity));
                            u_terminateChars(langtag, langtagCapacity, reslen, status);
                            done = TRUE;
                        } else if (strict) {
                            *status = U_ILLEGAL_ARGUMENT_ERROR;
                            done = TRUE;
                        }
                        /* if not strict mode, then "und" will be returned */
                    } else {
                        *status = U_ILLEGAL_ARGUMENT_ERROR;
                        done = TRUE;
                    }
                }
            }
            uenum_close(kwdEnum);
            if (done) {
                return reslen;
            }
        }
    }

    reslen += _appendLanguageToLanguageTag(canonical.data(), langtag, langtagCapacity, strict, status);
    reslen += _appendScriptToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendRegionToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendVariantsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, &hadPosix, status);
    reslen += _appendKeywordsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);
    reslen += _appendPrivateuseToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);

    return reslen;
}